

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx::forward_inplace(BinaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256 afVar4;
  int iVar5;
  int iVar6;
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [16];
  int iVar9;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [56];
  float fVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 in_ZMM2 [64];
  undefined1 auVar26 [64];
  __m128 afVar30;
  binary_op_pow_pack8 op;
  __m256 _b;
  binary_op_pow_pack8 local_121;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [3] [32];
  __m256 local_80 [2];
  
  afVar4 = local_80[0];
  p_Var1 = this->_vptr_BinaryOp_x86_avx[-3];
  if (bottom_top_blob->elempack == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
    case 0:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar12._0_4_ = (float)local_120._0_4_ + *(float *)*pauVar8;
          auVar12._4_4_ = (float)local_120._4_4_ + *(float *)(*pauVar8 + 4);
          auVar12._8_4_ = fStack_118 + *(float *)(*pauVar8 + 8);
          auVar12._12_4_ = fStack_114 + *(float *)(*pauVar8 + 0xc);
          *pauVar8 = auVar12;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 1:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar15 = vsubps_avx(*pauVar8,_local_120);
          *pauVar8 = auVar15;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 2:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar13._0_4_ = (float)local_120._0_4_ * *(float *)*pauVar8;
          auVar13._4_4_ = (float)local_120._4_4_ * *(float *)(*pauVar8 + 4);
          auVar13._8_4_ = fStack_118 * *(float *)(*pauVar8 + 8);
          auVar13._12_4_ = fStack_114 * *(float *)(*pauVar8 + 0xc);
          *pauVar8 = auVar13;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 3:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      auVar15._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
      auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
      _local_120 = vshufps_avx(auVar15,auVar15,0);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar16._0_4_ = (float)local_120._0_4_ * *(float *)*pauVar8;
          auVar16._4_4_ = (float)local_120._4_4_ * *(float *)(*pauVar8 + 4);
          auVar16._8_4_ = fStack_118 * *(float *)(*pauVar8 + 8);
          auVar16._12_4_ = fStack_114 * *(float *)(*pauVar8 + 0xc);
          *pauVar8 = auVar16;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 4:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar15 = vmaxps_avx(_local_120,*pauVar8);
          *pauVar8 = auVar15;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 5:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar15 = vminps_avx(_local_120,*pauVar8);
          *pauVar8 = auVar15;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 6:
      local_80[0][1] = *(float *)(&this->field_0xd8 + (long)p_Var1);
      local_80[0][0] = local_80[0][1];
      local_80[0][2] = local_80[0][1];
      local_80[0][3] = local_80[0][1];
      local_e8 = bottom_top_blob->h * bottom_top_blob->w;
      local_80[0]._16_16_ = afVar4._16_16_;
      iVar5 = 0;
      if (local_e8 < 1) {
        local_e8 = 0;
      }
      local_e4 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        local_e4 = iVar5;
      }
      while (iVar5 != local_e4) {
        local_120._0_4_ = iVar5;
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar5);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar5 = local_e8;
        while (bVar11 = iVar5 != 0, iVar5 = iVar5 + -1, bVar11) {
          auVar24 = ZEXT856(*(ulong *)(*pauVar8 + 8));
          local_e0[0]._0_16_ = *pauVar8;
          afVar30 = binary_op_pow_pack4::operator()
                              ((binary_op_pow_pack4 *)&local_121,(__m128 *)local_e0,
                               (__m128 *)local_80);
          auVar22._0_8_ = afVar30._0_8_;
          auVar22._8_56_ = auVar24;
          *pauVar8 = auVar22._0_16_;
          pauVar8 = pauVar8 + 1;
        }
        iVar5 = local_120._0_4_ + 1;
      }
      break;
    case 7:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar15 = vsubps_avx(_local_120,*pauVar8);
          *pauVar8 = auVar15;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    case 8:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar8 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar15 = *pauVar8;
          auVar16 = vrcpps_avx(auVar15);
          fVar25 = local_120._0_4_ * auVar16._0_4_;
          fVar27 = local_120._4_4_ * auVar16._4_4_;
          fVar28 = local_120._8_4_ * auVar16._8_4_;
          fVar29 = local_120._12_4_ * auVar16._12_4_;
          auVar17._0_4_ = auVar15._0_4_ * fVar25;
          auVar17._4_4_ = auVar15._4_4_ * fVar27;
          auVar17._8_4_ = auVar15._8_4_ * fVar28;
          auVar17._12_4_ = auVar15._12_4_ * fVar29;
          auVar15 = vsubps_avx(_local_120,auVar17);
          auVar18._0_4_ = fVar25 + auVar16._0_4_ * auVar15._0_4_;
          auVar18._4_4_ = fVar27 + auVar16._4_4_ * auVar15._4_4_;
          auVar18._8_4_ = fVar28 + auVar16._8_4_ * auVar15._8_4_;
          auVar18._12_4_ = fVar29 + auVar16._12_4_ * auVar15._12_4_;
          *pauVar8 = auVar18;
          pauVar8 = pauVar8 + 1;
        }
      }
      break;
    default:
      goto switchD_00249378_default;
    }
    goto LAB_00249d4c;
  }
  if (bottom_top_blob->elempack == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
    case 0:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar19._0_4_ = (float)local_120._0_4_ + *(float *)*pauVar7;
          auVar19._4_4_ = (float)local_120._4_4_ + *(float *)(*pauVar7 + 4);
          auVar19._8_4_ = fStack_118 + *(float *)(*pauVar7 + 8);
          auVar19._12_4_ = fStack_114 + *(float *)(*pauVar7 + 0xc);
          auVar19._16_4_ = fStack_110 + *(float *)(*pauVar7 + 0x10);
          auVar19._20_4_ = fStack_10c + *(float *)(*pauVar7 + 0x14);
          auVar19._24_4_ = fStack_108 + *(float *)(*pauVar7 + 0x18);
          auVar19._28_4_ = fStack_104 + *(float *)(*pauVar7 + 0x1c);
          *pauVar7 = auVar19;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 1:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar19 = vsubps_avx(*pauVar7,_local_120);
          *pauVar7 = auVar19;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 2:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar21._0_4_ = (float)local_120._0_4_ * *(float *)*pauVar7;
          auVar21._4_4_ = (float)local_120._4_4_ * *(float *)(*pauVar7 + 4);
          auVar21._8_4_ = fStack_118 * *(float *)(*pauVar7 + 8);
          auVar21._12_4_ = fStack_114 * *(float *)(*pauVar7 + 0xc);
          auVar21._16_4_ = fStack_110 * *(float *)(*pauVar7 + 0x10);
          auVar21._20_4_ = fStack_10c * *(float *)(*pauVar7 + 0x14);
          auVar21._28_36_ = in_ZMM0._28_36_;
          auVar21._24_4_ = fStack_108 * *(float *)(*pauVar7 + 0x18);
          in_ZMM0 = ZEXT3264(auVar21._0_32_);
          *pauVar7 = auVar21._0_32_;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 3:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      auVar14._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
      auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar15 = vshufps_avx(auVar14,auVar14,0);
      auVar22 = ZEXT1664(auVar15);
      _fStack_110 = auVar15;
      _local_120 = auVar15;
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        auVar22 = ZEXT1664(auVar22._0_16_);
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar23._0_4_ = (float)local_120._0_4_ * *(float *)*pauVar7;
          auVar23._4_4_ = (float)local_120._4_4_ * *(float *)(*pauVar7 + 4);
          auVar23._8_4_ = fStack_118 * *(float *)(*pauVar7 + 8);
          auVar23._12_4_ = fStack_114 * *(float *)(*pauVar7 + 0xc);
          auVar23._16_4_ = fStack_110 * *(float *)(*pauVar7 + 0x10);
          auVar23._20_4_ = fStack_10c * *(float *)(*pauVar7 + 0x14);
          auVar23._28_36_ = auVar22._28_36_;
          auVar23._24_4_ = fStack_108 * *(float *)(*pauVar7 + 0x18);
          auVar22 = ZEXT3264(auVar23._0_32_);
          *pauVar7 = auVar23._0_32_;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 4:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar19 = vmaxps_avx(_local_120,*pauVar7);
          *pauVar7 = auVar19;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 5:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar19 = vminps_avx(_local_120,*pauVar7);
          *pauVar7 = auVar19;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 6:
      fVar25 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      local_80[0][1] = fVar25;
      local_80[0][0] = fVar25;
      local_80[0][2] = fVar25;
      local_80[0][3] = fVar25;
      local_80[0][4] = fVar25;
      local_80[0][5] = fVar25;
      local_80[0][6] = fVar25;
      local_80[0][7] = fVar25;
      local_e8 = bottom_top_blob->h * bottom_top_blob->w;
      iVar5 = 0;
      if (local_e8 < 1) {
        local_e8 = 0;
      }
      local_e4 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        local_e4 = iVar5;
      }
      while (iVar5 != local_e4) {
        local_120._0_4_ = iVar5;
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar5);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar5 = local_e8;
        while (bVar11 = iVar5 != 0, iVar5 = iVar5 + -1, bVar11) {
          local_e0[0] = *pauVar7;
          auVar19 = local_e0[0];
          binary_op_pow_pack8::operator()(&local_121,(__m256 *)local_e0,local_80);
          *pauVar7 = auVar19;
          pauVar7 = pauVar7 + 1;
        }
        iVar5 = local_120._0_4_ + 1;
      }
      break;
    case 7:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar19 = vsubps_avx(_local_120,*pauVar7);
          *pauVar7 = auVar19;
          pauVar7 = pauVar7 + 1;
        }
      }
      break;
    case 8:
      iVar5 = bottom_top_blob->h * bottom_top_blob->w;
      local_120._4_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar10;
      }
      iVar9 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar9 = 0;
      }
      local_120._0_4_ = local_120._4_4_;
      fStack_118 = (float)local_120._4_4_;
      fStack_114 = (float)local_120._4_4_;
      fStack_110 = (float)local_120._4_4_;
      fStack_10c = (float)local_120._4_4_;
      fStack_108 = (float)local_120._4_4_;
      fStack_104 = (float)local_120._4_4_;
      for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar10);
        pauVar7 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar6 = iVar5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          auVar19 = *pauVar7;
          auVar2 = vrcpps_avx(auVar19);
          auVar26._0_4_ = local_120._0_4_ * auVar2._0_4_;
          auVar26._4_4_ = local_120._4_4_ * auVar2._4_4_;
          auVar26._8_4_ = local_120._8_4_ * auVar2._8_4_;
          auVar26._12_4_ = local_120._12_4_ * auVar2._12_4_;
          auVar26._16_4_ = local_120._16_4_ * auVar2._16_4_;
          auVar26._20_4_ = local_120._20_4_ * auVar2._20_4_;
          auVar26._28_36_ = in_ZMM2._28_36_;
          auVar26._24_4_ = local_120._24_4_ * auVar2._24_4_;
          auVar3._4_4_ = auVar19._4_4_ * auVar26._4_4_;
          auVar3._0_4_ = auVar19._0_4_ * auVar26._0_4_;
          auVar3._8_4_ = auVar19._8_4_ * auVar26._8_4_;
          auVar3._12_4_ = auVar19._12_4_ * auVar26._12_4_;
          auVar3._16_4_ = auVar19._16_4_ * auVar26._16_4_;
          auVar3._20_4_ = auVar19._20_4_ * auVar26._20_4_;
          auVar3._24_4_ = auVar19._24_4_ * auVar26._24_4_;
          auVar3._28_4_ = auVar19._28_4_;
          auVar19 = vsubps_avx(_local_120,auVar3);
          auVar20._0_4_ = auVar26._0_4_ + auVar2._0_4_ * auVar19._0_4_;
          auVar20._4_4_ = auVar26._4_4_ + auVar2._4_4_ * auVar19._4_4_;
          auVar20._8_4_ = auVar26._8_4_ + auVar2._8_4_ * auVar19._8_4_;
          auVar20._12_4_ = auVar26._12_4_ + auVar2._12_4_ * auVar19._12_4_;
          auVar20._16_4_ = auVar26._16_4_ + auVar2._16_4_ * auVar19._16_4_;
          auVar20._20_4_ = auVar26._20_4_ + auVar2._20_4_ * auVar19._20_4_;
          auVar20._24_4_ = auVar26._24_4_ + auVar2._24_4_ * auVar19._24_4_;
          auVar20._28_4_ = in_ZMM2._28_4_ + auVar19._28_4_;
          *pauVar7 = auVar20;
          pauVar7 = pauVar7 + 1;
          in_ZMM2 = ZEXT3264(auVar26._0_32_);
        }
      }
      break;
    default:
      goto switchD_00249378_default;
    }
LAB_00249d4c:
    iVar5 = 0;
  }
  else {
switchD_00249378_default:
    iVar5 = BinaryOp::forward_inplace
                      ((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_avx + (long)p_Var1),
                       bottom_top_blob,opt);
  }
  return iVar5;
}

Assistant:

int BinaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}